

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

int google::OpenObjectFileContainingPcAndGetStartAddress
              (uint64_t pc,uint64_t *start_address,uint64_t *base_address,char *out_file_name,
              size_t out_file_name_size)

{
  size_t sVar1;
  uint64_t uVar2;
  uint fd;
  uint fd_00;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  char *pcVar6;
  ulong uVar7;
  ssize_t sVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  size_t __n;
  Elf64_Addr EVar14;
  char local_508 [8];
  char buf [1024];
  int local_100 [2];
  Elf64_Ehdr ehdr;
  uint64_t file_offset;
  long local_b0;
  ulong local_88;
  uint64_t end_address;
  char *local_78;
  char *local_70;
  size_t local_68;
  uint64_t local_60;
  char *local_58;
  char *local_50;
  size_t *local_48;
  size_t local_40;
  size_t *local_38;
  
  local_60 = pc;
  local_48 = base_address;
  local_38 = start_address;
  do {
    fd = open("/proc/self/maps",0);
    pcVar6 = out_file_name;
    if (-1 < (int)fd) goto LAB_001216cb;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  iVar3 = -1;
  goto LAB_001216f6;
  while (piVar4 = __errno_location(), pcVar6 = local_70, *piVar4 == 4) {
LAB_001216cb:
    local_70 = pcVar6;
    fd_00 = open("/proc/self/mem",0);
    if (-1 < (int)fd_00) {
      pcVar6 = local_508;
      local_40 = 0;
      pcVar9 = pcVar6;
      local_68 = out_file_name_size;
      goto LAB_0012172b;
    }
  }
LAB_001216e8:
  iVar3 = -1;
  goto LAB_001216ee;
LAB_0012172b:
  do {
    sVar1 = local_40;
    if (local_508 == pcVar9) {
      sVar8 = ReadFromOffset(fd,local_508,0x400,local_40);
      if (sVar8 < 1) goto LAB_001216e8;
      local_40 = sVar1 + sVar8;
      pcVar13 = local_508;
      pcVar9 = local_508 + sVar8;
    }
    else {
      pcVar13 = pcVar6 + 1;
      if (pcVar9 < pcVar13) {
        abort();
      }
      __n = (long)pcVar9 - (long)pcVar13;
      local_50 = pcVar9;
      pvVar5 = memchr(pcVar13,10,__n);
      pcVar9 = local_50;
      if (pvVar5 == (void *)0x0) {
        memmove(local_508,pcVar13,__n);
        sVar1 = local_40;
        sVar8 = ReadFromOffset(fd,local_508 + __n,0x400 - __n,local_40);
        if (sVar8 < 1) goto LAB_001216e8;
        local_40 = sVar1 + sVar8;
        pcVar13 = local_508;
        pcVar9 = local_508 + __n + sVar8;
      }
    }
    pcVar6 = (char *)memchr(pcVar13,10,(long)pcVar9 - (long)pcVar13);
    if (pcVar6 == (char *)0x0) goto LAB_001216e8;
    *pcVar6 = '\0';
    pcVar13 = GetHex(pcVar13,pcVar6,local_38);
    if ((((pcVar13 == pcVar6) || (*pcVar13 != '-')) ||
        (pcVar13 = GetHex(pcVar13 + 1,pcVar6,&local_88), pcVar13 == pcVar6)) ||
       ((*pcVar13 != ' ' || (local_58 = pcVar13 + 1, pcVar6 <= local_58)))) goto LAB_001216e8;
    uVar11 = (long)pcVar6 - (long)pcVar13;
    uVar7 = 1;
    do {
      if (pcVar13[uVar7] == ' ') {
        uVar11 = uVar7;
        pcVar12 = pcVar13 + uVar7;
        break;
      }
      uVar7 = uVar7 + 1;
      pcVar12 = pcVar6;
    } while (uVar11 != uVar7);
    if ((uVar11 < 5) || (pcVar12 == pcVar6)) goto LAB_001216e8;
    uVar2 = end_address;
    local_78 = pcVar12;
    local_50 = pcVar9;
    if ((*local_58 == 'r') &&
       ((sVar8 = ReadFromOffset(fd_00,local_100,0x40,*local_38), uVar2 = end_address, sVar8 == 0x40
        && (local_100[0] == 0x464c457f)))) {
      if (ehdr.e_ident._8_2_ == 2) {
        *local_48 = 0;
      }
      else if (ehdr.e_ident._8_2_ == 3) {
        *local_48 = *local_38;
        uVar11 = (ulong)(ushort)ehdr.e_flags;
        EVar14 = ehdr.e_entry;
        while (end_address = uVar11, end_address != 0) {
          sVar8 = ReadFromOffset(fd_00,&ehdr.e_phnum,0x38,*local_38 + EVar14);
          uVar2 = end_address;
          if (((sVar8 == 0x38) && (ehdr._56_4_ == 1)) && (file_offset == 0)) {
            *local_48 = *local_38 - local_b0;
            break;
          }
          EVar14 = EVar14 + 0x38;
          uVar11 = end_address - 1;
        }
      }
    }
    end_address = uVar2;
    pcVar9 = local_50;
  } while (((local_60 < *local_38) || (local_88 <= local_60)) ||
          ((*local_58 != 'r' || (pcVar13[3] != 'x'))));
  pcVar9 = GetHex(local_78 + 1,pcVar6,(uint64_t *)&ehdr.e_phnum);
  sVar1 = local_68;
  iVar3 = -1;
  if ((pcVar9 != pcVar6) && (*pcVar9 == ' ')) {
    pcVar13 = pcVar9 + 1;
    pcVar12 = pcVar13;
    if (pcVar13 < pcVar6) {
      iVar10 = 0;
      pcVar9 = pcVar6 + ~(ulong)pcVar9;
      do {
        if (*pcVar13 == ' ') {
          iVar10 = iVar10 + 1;
        }
        else {
          pcVar12 = pcVar13;
          if (1 < iVar10) break;
        }
        pcVar13 = pcVar13 + 1;
        pcVar9 = pcVar9 + -1;
        pcVar12 = pcVar6;
      } while (pcVar9 != (char *)0x0);
    }
    if (pcVar12 != pcVar6) {
      do {
        iVar3 = open(pcVar12,0);
        if (-1 < iVar3) goto LAB_001216ee;
        piVar4 = __errno_location();
        pcVar6 = local_70;
      } while (*piVar4 == 4);
      strncpy(local_70,pcVar12,sVar1);
      pcVar6[sVar1 - 1] = '\0';
      goto LAB_001216e8;
    }
  }
LAB_001216ee:
  anon_unknown_3::FileDescriptor::~FileDescriptor((FileDescriptor *)(ulong)fd_00);
LAB_001216f6:
  anon_unknown_3::FileDescriptor::~FileDescriptor((FileDescriptor *)(ulong)fd);
  return iVar3;
}

Assistant:

static ATTRIBUTE_NOINLINE int
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t &start_address,
                                             uint64_t &base_address,
                                             char *out_file_name,
                                             size_t out_file_name_size) {
  int object_fd;

  int maps_fd;
  NO_INTR(maps_fd = open("/proc/self/maps", O_RDONLY));
  FileDescriptor wrapped_maps_fd(maps_fd);
  if (wrapped_maps_fd.get() < 0) {
    return -1;
  }

  int mem_fd;
  NO_INTR(mem_fd = open("/proc/self/mem", O_RDONLY));
  FileDescriptor wrapped_mem_fd(mem_fd);
  if (wrapped_mem_fd.get() < 0) {
    return -1;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  unsigned num_maps = 0;
  LineReader reader(wrapped_maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    num_maps++;
    const char *cursor;
    const char *eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return -1;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char * const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return -1;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd, &ehdr, sizeof(ElfW(Ehdr)), start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd, &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (!(start_address <= pc && pc < end_address)) {
      continue;  // We skip this map.  PC isn't in this map.
    }

   // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return -1;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return -1;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    NO_INTR(object_fd = open(cursor, O_RDONLY));
    if (object_fd < 0) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return -1;
    }
    return object_fd;
  }
}